

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall simple_json::Stream::emit_json_key_object(Stream *this,string *key)

{
  _Elt_pointer ppVar1;
  bool local_d;
  Type local_c;
  
  emit_json_key(this,key);
  spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,"{\n",2);
  this->indent = this->indent + 1;
  local_c = Object;
  local_d = false;
  ppVar1 = (this->stack).c.
           super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar1 == (this->stack).c.
                super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>
    ::_M_push_back_aux<simple_json::Type,bool>
              ((deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>
                *)this,&local_c,&local_d);
  }
  else {
    ppVar1->first = Object;
    ppVar1->second = false;
    (this->stack).c.
    super__Deque_base<std::pair<simple_json::Type,_bool>,_std::allocator<std::pair<simple_json::Type,_bool>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar1 + 1;
  }
  return;
}

Assistant:

void Stream::emit_json_key_object(const std::string &key)
{
	emit_json_key(key);
	statement_inner("{\n");
	++indent;
	stack.emplace(Type::Object, false);
}